

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.hpp
# Opt level: O0

void __thiscall
Diligent::PipelineStateBase<Diligent::EngineVkImplTraits>::CopyResourceSignatures
          (PipelineStateBase<Diligent::EngineVkImplTraits> *this,PipelineStateCreateInfo *CreateInfo
          ,FixedLinearAllocator *MemPool)

{
  bool bVar1;
  PSO_CREATE_INTERNAL_FLAGS PVar2;
  uint uVar3;
  RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl> *Args_1;
  Char *pCVar4;
  PipelineResourceSignatureDesc *pPVar5;
  PipelineResourceSignatureVkImpl *pPVar6;
  PipelineResourceSignatureDesc *Args_4;
  char (*Args_1_00) [22];
  char (*in_stack_fffffffffffffea8) [100];
  char *local_108;
  Char *local_100;
  uint local_f4;
  undefined1 local_f0 [8];
  string msg_4;
  SHADER_TYPE ShaderType;
  Uint32 StageCount;
  Uint32 s;
  string msg_3;
  string msg_2;
  undefined1 local_78 [4];
  Uint32 Index;
  string msg_1;
  PipelineResourceSignatureImplType *pSignature;
  Uint32 i;
  undefined1 local_40 [8];
  string msg;
  FixedLinearAllocator *MemPool_local;
  PipelineStateCreateInfo *CreateInfo_local;
  PipelineStateBase<Diligent::EngineVkImplTraits> *this_local;
  
  msg.field_2._8_8_ = MemPool;
  Args_1 = FixedLinearAllocator::
           ConstructArray<Diligent::RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl>>
                     (MemPool,(ulong)this->m_SignatureCount);
  this->m_Signatures = Args_1;
  if ((this->m_UsingImplicitSignature & 1U) != 0) {
    PVar2 = GetInternalCreateFlags(CreateInfo);
    PVar2 = Diligent::operator&(PVar2,PSO_CREATE_INTERNAL_FLAG_IMPLICIT_SIGNATURE0);
    if (PVar2 == PSO_CREATE_INTERNAL_FLAG_NONE) {
      return;
    }
  }
  if ((CreateInfo->ResourceSignaturesCount == 0) ||
     (CreateInfo->ppResourceSignatures == (IPipelineResourceSignature **)0x0)) {
    FormatString<char[26],char[86]>
              ((string *)local_40,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])
               "CreateInfo.ResourceSignaturesCount != 0 && CreateInfo.ppResourceSignatures != nullptr"
               ,(char (*) [86])Args_1);
    pCVar4 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar4,"CopyResourceSignatures",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x4fb);
    std::__cxx11::string::~string((string *)local_40);
  }
  for (pSignature._0_4_ = 0; (uint)pSignature < CreateInfo->ResourceSignaturesCount;
      pSignature._0_4_ = (uint)pSignature + 1) {
    Args_1_00 = (char (*) [22])(ulong)(uint)pSignature;
    msg_1.field_2._8_8_ =
         ClassPtrCast<Diligent::PipelineResourceSignatureVkImpl,Diligent::IPipelineResourceSignature>
                   (CreateInfo->ppResourceSignatures[(long)Args_1_00]);
    if ((PipelineResourceSignatureVkImpl *)msg_1.field_2._8_8_ ==
        (PipelineResourceSignatureVkImpl *)0x0) {
      FormatString<char[26],char[22]>
                ((string *)local_78,(Diligent *)"Debug expression failed:\n",(char (*) [26])0xe34249
                 ,Args_1_00);
      pCVar4 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar4,"CopyResourceSignatures",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
                 ,0x4ff);
      std::__cxx11::string::~string((string *)local_78);
    }
    pPVar5 = DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
             ::GetDesc((DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                        *)msg_1.field_2._8_8_);
    uVar3 = (uint)pPVar5->BindingIndex;
    if (this->m_SignatureCount <= uVar3) {
      FormatString<char[26],char[25]>
                ((string *)((long)&msg_3.field_2 + 8),(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"Index < m_SignatureCount",
                 (char (*) [25])(ulong)this->m_SignatureCount);
      pCVar4 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar4,"CopyResourceSignatures",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
                 ,0x504);
      std::__cxx11::string::~string((string *)(msg_3.field_2._M_local_buf + 8));
    }
    pPVar6 = Diligent::RefCntAutoPtr::operator_cast_to_PipelineResourceSignatureVkImpl_
                       ((RefCntAutoPtr *)(this->m_Signatures + uVar3));
    if (pPVar6 != (PipelineResourceSignatureVkImpl *)0x0) {
      pPVar5 = DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
               ::GetDesc((DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                          *)msg_1.field_2._8_8_);
      StageCount = uVar3;
      pPVar6 = RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl>::operator->
                         (this->m_Signatures + uVar3);
      Args_4 = DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
               ::GetDesc((DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                          *)pPVar6);
      FormatString<char[30],char_const*,char[12],unsigned_int,char[45],char_const*,char[100]>
                ((string *)&s,(Diligent *)"Pipeline resource signature \'",(char (*) [30])pPVar5,
                 (char **)"\' at index ",(char (*) [12])&StageCount,
                 (uint *)" conflicts with another resource signature \'",(char (*) [45])Args_4,
                 (char **)
                 "\' that uses the same index. This error should\'ve been caught by ValidatePipelineResourceSignatures."
                 ,in_stack_fffffffffffffea8);
      pCVar4 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar4,"CopyResourceSignatures",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
                 ,0x509);
      std::__cxx11::string::~string((string *)&s);
    }
    ShaderType = SHADER_TYPE_UNKNOWN;
    msg_4.field_2._12_4_ =
         PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::GetNumActiveShaderStages
                   ((PipelineResourceSignatureBase<Diligent::EngineVkImplTraits> *)
                    msg_1.field_2._8_8_);
    for (; ShaderType < (uint)msg_4.field_2._12_4_; ShaderType = ShaderType + SHADER_TYPE_VERTEX) {
      msg_4.field_2._8_4_ =
           PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::GetActiveShaderStageType
                     ((PipelineResourceSignatureBase<Diligent::EngineVkImplTraits> *)
                      msg_1.field_2._8_8_,ShaderType);
      bVar1 = IsConsistentShaderType(msg_4.field_2._8_4_,(CreateInfo->PSODesc).PipelineType);
      if (!bVar1) {
        pPVar5 = DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                 ::GetDesc((DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                            *)msg_1.field_2._8_8_);
        local_f4 = uVar3;
        local_100 = GetShaderTypeLiteralName(msg_4.field_2._8_4_);
        local_108 = GetPipelineTypeString((CreateInfo->PSODesc).PipelineType);
        in_stack_fffffffffffffea8 = (char (*) [100])&local_108;
        FormatString<char[30],char_const*,char[12],unsigned_int,char[20],char_const*,char[46],char_const*,char[3]>
                  ((string *)local_f0,(Diligent *)"Pipeline resource signature \'",
                   (char (*) [30])pPVar5,(char **)"\' at index ",(char (*) [12])&local_f4,
                   (uint *)" has shader stage \'",(char (*) [20])&local_100,
                   (char **)"\' that is not compatible with pipeline type \'",
                   (char (*) [46])in_stack_fffffffffffffea8,(char **)"\'.",(char (*) [3])pPVar5);
        pCVar4 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar4,"CopyResourceSignatures",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
                   ,0x511);
        std::__cxx11::string::~string((string *)local_f0);
      }
    }
    RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl>::operator=
              (this->m_Signatures + uVar3,(PipelineResourceSignatureVkImpl *)msg_1.field_2._8_8_);
  }
  return;
}

Assistant:

void CopyResourceSignatures(const PipelineStateCreateInfo& CreateInfo, FixedLinearAllocator& MemPool)
    {
        m_Signatures = MemPool.ConstructArray<SignatureAutoPtrType>(m_SignatureCount);
        if (!m_UsingImplicitSignature || (GetInternalCreateFlags(CreateInfo) & PSO_CREATE_INTERNAL_FLAG_IMPLICIT_SIGNATURE0) != 0)
        {
            VERIFY_EXPR(CreateInfo.ResourceSignaturesCount != 0 && CreateInfo.ppResourceSignatures != nullptr);
            for (Uint32 i = 0; i < CreateInfo.ResourceSignaturesCount; ++i)
            {
                PipelineResourceSignatureImplType* pSignature = ClassPtrCast<PipelineResourceSignatureImplType>(CreateInfo.ppResourceSignatures[i]);
                VERIFY_EXPR(pSignature != nullptr);

                const Uint32 Index = pSignature->GetDesc().BindingIndex;

#ifdef DILIGENT_DEBUG
                VERIFY_EXPR(Index < m_SignatureCount);

                VERIFY(m_Signatures[Index] == nullptr,
                       "Pipeline resource signature '", pSignature->GetDesc().Name, "' at index ", Uint32{Index},
                       " conflicts with another resource signature '", m_Signatures[Index]->GetDesc().Name,
                       "' that uses the same index. This error should've been caught by ValidatePipelineResourceSignatures.");

                for (Uint32 s = 0, StageCount = pSignature->GetNumActiveShaderStages(); s < StageCount; ++s)
                {
                    const SHADER_TYPE ShaderType = pSignature->GetActiveShaderStageType(s);
                    VERIFY(IsConsistentShaderType(ShaderType, CreateInfo.PSODesc.PipelineType),
                           "Pipeline resource signature '", pSignature->GetDesc().Name, "' at index ", Uint32{Index},
                           " has shader stage '", GetShaderTypeLiteralName(ShaderType), "' that is not compatible with pipeline type '",
                           GetPipelineTypeString(CreateInfo.PSODesc.PipelineType), "'.");
                }
#endif

                m_Signatures[Index] = pSignature;
            }
        }
    }